

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForwardingTimeCoordinator.hpp
# Opt level: O3

void __thiscall
helics::ForwardingTimeCoordinator::ForwardingTimeCoordinator(ForwardingTimeCoordinator *this)

{
  BaseTimeCoordinator::BaseTimeCoordinator(&this->super_BaseTimeCoordinator);
  (this->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator =
       (_func_int **)&PTR__BaseTimeCoordinator_004dc640;
  (this->upstream).super_TimeData.next.internalTimeCode = -1;
  (this->upstream).super_TimeData.Te.internalTimeCode = 0;
  (this->upstream).super_TimeData.minDe.internalTimeCode = 0;
  (this->upstream).super_TimeData.TeAlt.internalTimeCode = 0;
  (this->upstream).super_TimeData.lastGrant.internalTimeCode = 0;
  (this->upstream).super_TimeData.minFed = -2010000000;
  (this->upstream).super_TimeData.minFedActual = -2010000000;
  (this->upstream).super_TimeData.mTimeState = initialized;
  (this->upstream).super_TimeData.hasData = false;
  (this->upstream).super_TimeData.interrupted = false;
  (this->upstream).super_TimeData.delayedTiming = false;
  (this->upstream).super_TimeData.timingVersion = -2;
  (this->upstream).super_TimeData.restrictionLevel = '\0';
  (this->upstream).super_TimeData.timeoutCount = 0;
  (this->upstream).super_TimeData.sequenceCounter = 0;
  (this->upstream).super_TimeData.responseSequenceCounter = 0;
  (this->upstream).super_TimeData.grantedIteration = 0;
  (this->upstream).fedID.gid = -2010000000;
  (this->upstream).cyclic = false;
  (this->upstream).connection = INDEPENDENT;
  (this->upstream).dependent = false;
  (this->upstream).dependency = false;
  (this->upstream).forwarding = false;
  (this->upstream).nonGranting = false;
  (this->upstream).triggered = false;
  (this->upstream).updateRequested = false;
  (this->downstream).super_TimeData.next.internalTimeCode = -1;
  (this->downstream).super_TimeData.Te.internalTimeCode = 0;
  (this->downstream).super_TimeData.minDe.internalTimeCode = 0;
  (this->downstream).super_TimeData.TeAlt.internalTimeCode = 0;
  (this->downstream).super_TimeData.lastGrant.internalTimeCode = 0;
  (this->downstream).super_TimeData.minFed = -2010000000;
  (this->downstream).super_TimeData.minFedActual = -2010000000;
  (this->downstream).super_TimeData.mTimeState = initialized;
  (this->downstream).super_TimeData.hasData = false;
  (this->downstream).super_TimeData.interrupted = false;
  (this->downstream).super_TimeData.delayedTiming = false;
  (this->downstream).super_TimeData.timingVersion = -2;
  (this->downstream).super_TimeData.restrictionLevel = '\0';
  (this->downstream).super_TimeData.timeoutCount = 0;
  (this->downstream).super_TimeData.sequenceCounter = 0;
  (this->downstream).super_TimeData.responseSequenceCounter = 0;
  (this->downstream).super_TimeData.grantedIteration = 0;
  (this->downstream).fedID.gid = -2010000000;
  (this->downstream).cyclic = false;
  (this->downstream).connection = INDEPENDENT;
  (this->downstream).dependent = false;
  (this->downstream).dependency = false;
  (this->downstream).forwarding = false;
  (this->downstream).nonGranting = false;
  (this->downstream).triggered = false;
  (this->downstream).updateRequested = false;
  this->iterating = false;
  this->ignoreMinFed = false;
  this->sequenceModifier = 0;
  return;
}

Assistant:

ForwardingTimeCoordinator() = default;